

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1fad4::FileSystemTest_testRecursiveRemoval_Test::TestBody
          (FileSystemTest_testRecursiveRemoval_Test *this)

{
  long *plVar1;
  char cVar2;
  char *pcVar3;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var4;
  char *pcVar5;
  int *rhs;
  pointer *__ptr;
  __mode_t _Var6;
  int iVar7;
  StatStruct *this_01;
  char *in_R9;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Filename_00;
  AssertHelper local_568;
  AssertionResult gtest_ar__1;
  error_code ec;
  AssertionResult gtest_ar_;
  AssertHelper local_508;
  StatStruct statbuf;
  SmallString<256U> dir;
  SmallString<256U> tempDir;
  SmallString<256U> file;
  TmpDir rootTempDir;
  Twine *this_00;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&rootTempDir,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&file,&rootTempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&tempDir.super_SmallVector<char,_256U>,
             (char *)file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(CONCAT44(file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                               super_SmallVectorTemplateBase<char,_true>.
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               Capacity,file.super_SmallVector<char,_256U>.
                                        super_SmallVectorImpl<char>.
                                        super_SmallVectorTemplateBase<char,_true>.
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.Size) +
                     (long)file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  this_00 = (Twine *)&file;
  llvm::Twine::Twine(this_00,"root");
  llvm::Twine::Twine((Twine *)&dir,"");
  llvm::Twine::Twine((Twine *)&statbuf,"");
  llvm::Twine::Twine((Twine *)&ec,"");
  llvm::sys::path::append
            (&tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,this_00,
             (Twine *)&dir,(Twine *)&statbuf,(Twine *)&ec);
  _Var6 = (__mode_t)this_00;
  pcVar3 = llvm::SmallString<256U>::c_str
                     ((SmallString<256U> *)&tempDir.super_SmallVector<char,_256U>);
  llbuild::basic::sys::mkdir(pcVar3,_Var6);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&file.super_SmallVector<char,_256U>,
             (char *)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)((ulong)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                     + (long)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX));
  llvm::Twine::Twine((Twine *)&dir,"test.txt");
  llvm::Twine::Twine((Twine *)&statbuf,"");
  llvm::Twine::Twine((Twine *)&ec,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::sys::path::append
            (&file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&dir,
             (Twine *)&statbuf,(Twine *)&ec,(Twine *)&gtest_ar_);
  ec._M_value = 0;
  _Var4.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )std::_V2::system_category();
  Filename.Length._0_4_ =
       file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  Filename.Data =
       (char *)file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX;
  Filename.Length._4_4_ = 0;
  ec._M_cat = (error_category *)
              _Var4.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
  llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&dir,Filename,&ec,F_Text);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = ec._M_value == 0;
  if (ec._M_value != 0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&statbuf,(internal *)&gtest_ar_,(AssertionResult *)0x180e70,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x4c,(char *)statbuf.st_dev);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    std::__cxx11::string::_M_dispose();
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar7 = 0x180817;
  llvm::raw_ostream::operator<<((raw_ostream *)&dir,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&dir,iVar7);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&dir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&dir.super_SmallVector<char,_256U>,
             (char *)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)((ulong)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                     + (long)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX));
  this_01 = &statbuf;
  llvm::Twine::Twine((Twine *)this_01,"subdir");
  pcVar3 = "";
  llvm::Twine::Twine((Twine *)&ec,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::Twine::Twine((Twine *)&gtest_ar__1,"");
  llvm::sys::path::append
            (&dir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)this_01,
             (Twine *)&ec,(Twine *)&gtest_ar_,(Twine *)&gtest_ar__1);
  _Var6 = (__mode_t)this_01;
  pcVar5 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&dir.super_SmallVector<char,_256U>);
  llbuild::basic::sys::mkdir(pcVar5,_Var6);
  llvm::Twine::Twine((Twine *)&statbuf,"file_in_subdir.txt");
  llvm::Twine::Twine((Twine *)&ec,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::Twine::Twine((Twine *)&gtest_ar__1,"");
  llvm::sys::path::append
            (&dir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&statbuf,
             (Twine *)&ec,(Twine *)&gtest_ar_,(Twine *)&gtest_ar__1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  Filename_00.Length._4_4_ = 0;
  Filename_00._0_12_ =
       dir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var4.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&statbuf,Filename_00,(error_code *)&gtest_ar_,F_Text);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ = gtest_ar_._0_4_ == 0;
  if (gtest_ar_._0_4_ != 0) {
    testing::Message::Message((Message *)&local_568);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ec,(internal *)&gtest_ar__1,(AssertionResult *)0x180e70,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x59,(char *)CONCAT44(ec._4_4_,ec._M_value));
    testing::internal::AssertHelper::operator=(&local_508,(Message *)&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    std::__cxx11::string::_M_dispose();
    if ((long *)CONCAT44(local_568.data_._4_4_,(int)local_568.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_568.data_._4_4_,(int)local_568.data_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  iVar7 = 0x180817;
  llvm::raw_ostream::operator<<((raw_ostream *)&statbuf,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&statbuf,iVar7);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&statbuf);
  llbuild::basic::createLocalFileSystem();
  plVar1 = (long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_);
  pcVar5 = llvm::SmallString<256U>::c_str(&tempDir);
  std::__cxx11::string::string((string *)&statbuf,pcVar5,(allocator *)&ec);
  cVar2 = (**(code **)(*plVar1 + 0x28))(plVar1,&statbuf);
  std::__cxx11::string::_M_dispose();
  ec._M_value = CONCAT31(ec._M_value._1_3_,cVar2);
  ec._M_cat = (error_category *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&statbuf,(internal *)&ec,(AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x60,(char *)statbuf.st_dev);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    std::__cxx11::string::_M_dispose();
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ec._M_cat);
  gtest_ar__1.success_ = true;
  gtest_ar__1._1_3_ = 0xffffff;
  pcVar5 = llvm::SmallString<256U>::c_str(&tempDir);
  local_568.data_._0_4_ = llbuild::basic::sys::stat(pcVar5,(stat *)&statbuf);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&ec,"-1","sys::stat(tempDir.c_str(), &statbuf)",(int *)&gtest_ar__1,
             (int *)&local_568);
  if ((char)ec._M_value == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (ec._M_cat != (error_category *)0x0) {
      pcVar3 = *(char **)ec._M_cat;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ec._M_cat);
  gtest_ar__1.success_ = true;
  gtest_ar__1._1_3_ = 0;
  rhs = __errno_location();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&ec,"2","(*__errno_location ())",(int *)&gtest_ar__1,rhs);
  if ((char)ec._M_value == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (ec._M_cat == (error_category *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)ec._M_cat;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ec._M_cat);
  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
  }
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&dir);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&file);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&tempDir);
  llbuild::TmpDir::~TmpDir(&rootTempDir);
  return;
}

Assistant:

TEST(FileSystemTest, testRecursiveRemoval) {
  TmpDir rootTempDir(__func__);

  SmallString<256> tempDir { rootTempDir.str() };
  llvm::sys::path::append(tempDir, "root");
  sys::mkdir(tempDir.c_str());

  SmallString<256> file{ tempDir.str() };
  llvm::sys::path::append(file, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(file.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> dir{ tempDir.str() };
  llvm::sys::path::append(dir, "subdir");
  sys::mkdir(dir.c_str());

  llvm::sys::path::append(dir, "file_in_subdir.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(dir.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto fs = createLocalFileSystem();
  bool result = fs->remove(tempDir.c_str());
  EXPECT_TRUE(result);

  sys::StatStruct statbuf;
  EXPECT_EQ(-1, sys::stat(tempDir.c_str(), &statbuf));
  EXPECT_EQ(ENOENT, errno);
}